

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

bool cfd::core::RandomNumberUtil::GetRandomBool(vector<bool,_std::allocator<bool>_> *random_cache)

{
  int iVar1;
  result_type_conflict rVar2;
  ulong uVar3;
  CfdException *this;
  size_t __i;
  long lVar4;
  int i;
  uint uVar5;
  ulong uVar6;
  string local_40;
  
  if (GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd);
    if (iVar1 != 0) {
      std::random_device::random_device(&GetRandomBool::rd);
      __cxa_atexit(std::random_device::~random_device,&GetRandomBool::rd,&__dso_handle);
      __cxa_guard_release(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::rd);
    }
  }
  if (GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine == '\0') {
    iVar1 = __cxa_guard_acquire(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine);
    if (iVar1 != 0) {
      uVar5 = ::std::random_device::_M_getval();
      uVar3 = (ulong)uVar5;
      lVar4 = 1;
      GetRandomBool::engine._M_x[0] = uVar3;
      do {
        uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
        GetRandomBool::engine._M_x[lVar4] = uVar3;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x270);
      GetRandomBool::engine._M_p = 0x270;
      __cxa_guard_release(&GetRandomBool(std::vector<bool,std::allocator<bool>>*)::engine);
    }
  }
  if (random_cache != (vector<bool,_std::allocator<bool>_> *)0x0) {
    lVar4 = *(long *)(random_cache + 0x10);
    uVar5 = *(uint *)(random_cache + 0x18);
    if (uVar5 == 0 && *(long *)random_cache == lVar4) {
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&GetRandomBool::engine);
      uVar5 = 0;
      do {
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (random_cache,((uint)rVar2 >> (uVar5 & 0x1f) & 1) != 0);
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x20);
      uVar5 = *(uint *)(random_cache + 0x18);
      lVar4 = *(long *)(random_cache + 0x10);
    }
    uVar3 = (ulong)uVar5 - 1;
    uVar6 = (ulong)uVar5 + 0x3e;
    if (-1 < (long)uVar3) {
      uVar6 = uVar3;
    }
    uVar6 = *(ulong *)(lVar4 + ((long)uVar6 >> 6) * 8 + -8 +
                      (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) * 8);
    *(uint *)(random_cache + 0x18) = uVar5 - 1;
    if (uVar5 == 0) {
      *(undefined4 *)(random_cache + 0x18) = 0x3f;
      *(long *)(random_cache + 0x10) = lVar4 + -8;
    }
    return (uVar6 >> (uVar3 & 0x3f) & 1) != 0;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GetRandomBool error.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,&local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool RandomNumberUtil::GetRandomBool(std::vector<bool> *random_cache) {
#if defined(_WIN32) && defined(__GNUC__) && (__GNUC__ < 9)
  // for mingw gcc lower 9
  static std::mt19937 engine(static_cast<unsigned int>(time(nullptr)));
#else
  static std::random_device rd;
  static std::mt19937 engine(rd());
#endif
  if (random_cache == nullptr) {
    throw CfdException(kCfdIllegalArgumentError, "GetRandomBool error.");
  }

  if (random_cache->empty()) {
    uint32_t random = engine();
    for (int i = 0; i < 32; i++) {
      bool value = (random >> i) & 1;
      random_cache->push_back(value);
    }
  }
  bool ret = random_cache->back();
  random_cache->pop_back();
  return ret;
}